

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O3

void __thiscall ImPlotAxis::SetRange(ImPlotAxis *this,double _min,double _max)

{
  double __x;
  int iVar1;
  double dVar2;
  double dVar3;
  
  (this->Range).Min = _min;
  (this->Range).Max = _max;
  Constrain(this);
  dVar3 = (this->Range).Min;
  __x = (this->Range).Max;
  dVar2 = floor(dVar3);
  iVar1 = (int)(dVar3 * 1000000.0 + dVar2 * -1000000.0);
  (this->PickerTimeMin).S = (long)dVar3 + (long)(iVar1 / 1000000);
  (this->PickerTimeMin).Us = iVar1 % 1000000;
  dVar3 = floor(__x);
  iVar1 = (int)(__x * 1000000.0 + dVar3 * -1000000.0);
  (this->PickerTimeMax).S = (long)__x + (long)(iVar1 / 1000000);
  (this->PickerTimeMax).Us = iVar1 % 1000000;
  return;
}

Assistant:

void SetRange(double _min, double _max) {
        Range.Min = _min;
        Range.Max = _max;
        Constrain();
        PickerTimeMin = ImPlotTime::FromDouble(Range.Min);
        PickerTimeMax = ImPlotTime::FromDouble(Range.Max);
    }